

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strHex.cpp
# Opt level: O0

int jbcoin::charUnHex(uchar c)

{
  int iVar1;
  uchar c_local;
  
  if (charUnHex(unsigned_char)::xtab == '\0') {
    iVar1 = __cxa_guard_acquire(&charUnHex(unsigned_char)::xtab);
    if (iVar1 != 0) {
      charUnHex::HexTab::HexTab(&charUnHex::xtab);
      __cxa_guard_release(&charUnHex(unsigned_char)::xtab);
    }
  }
  iVar1 = charUnHex::HexTab::operator[](&charUnHex::xtab,c);
  return iVar1;
}

Assistant:

int charUnHex (unsigned char c)
{
    struct HexTab
    {
        int hex[256];

        HexTab ()
        {
            std::fill (std::begin (hex), std::end (hex), -1);
            for (int i = 0; i < 10; ++i)
                hex ['0'+i] = i;
            for (int i = 0; i < 6; ++i)
            {
                hex ['A'+i] = 10 + i;
                hex ['a'+i] = 10 + i;
            }
        }
        int operator[] (unsigned char c) const
        {
            return hex[c];
        }
    };

    static HexTab xtab;

    return xtab[c];
}